

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

bool vkt::memory::anon_unknown_0::supportsDeviceBufferWrites(Usage usage)

{
  undefined1 local_9;
  Usage usage_local;
  
  if ((usage & USAGE_TRANSFER_DST) == 0) {
    if ((usage & USAGE_STORAGE_BUFFER) == 0) {
      if ((usage & USAGE_STORAGE_TEXEL_BUFFER) == 0) {
        local_9 = false;
      }
      else {
        local_9 = true;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool supportsDeviceBufferWrites (Usage usage)
{
	if (usage & USAGE_TRANSFER_DST)
		return true;

	if (usage & USAGE_STORAGE_BUFFER)
		return true;

	if (usage & USAGE_STORAGE_TEXEL_BUFFER)
		return true;

	return false;
}